

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printUsage(void)

{
  fputs("Usage: rgbasm [-EHhLlVvw] [-b chars] [-D name[=value]] [-g chars] [-I path]\n              [-M depend_file] [-MG] [-MP] [-MT target_file] [-MQ target_file]\n              [-o out_file] [-P include_file] [-p pad_value] [-Q precision]\n              [-r depth] [-W warning] <file>\nUseful options:\n    -E, --export-all         export all labels\n    -M, --dependfile <path>  set the output dependency file\n    -o, --output <path>      set the output object file\n    -p, --pad-value <value>  set the value to use for `ds\'\n    -V, --version            print RGBASM version and exit\n    -W, --warning <warning>  enable or disable warnings\n\nFor help, use `man rgbasm\' or go to https://rgbds.gbdev.io/docs/\n"
        ,_stderr);
  return;
}

Assistant:

static void printUsage(void)
{
	fputs(
"Usage: rgbasm [-EHhLlVvw] [-b chars] [-D name[=value]] [-g chars] [-I path]\n"
"              [-M depend_file] [-MG] [-MP] [-MT target_file] [-MQ target_file]\n"
"              [-o out_file] [-P include_file] [-p pad_value] [-Q precision]\n"
"              [-r depth] [-W warning] <file>\n"
"Useful options:\n"
"    -E, --export-all         export all labels\n"
"    -M, --dependfile <path>  set the output dependency file\n"
"    -o, --output <path>      set the output object file\n"
"    -p, --pad-value <value>  set the value to use for `ds'\n"
"    -V, --version            print RGBASM version and exit\n"
"    -W, --warning <warning>  enable or disable warnings\n"
"\n"
"For help, use `man rgbasm' or go to https://rgbds.gbdev.io/docs/\n",
	      stderr);
}